

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O0

string * format(string *__return_storage_ptr__,string *value)

{
  string *value_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)value);
  return __return_storage_ptr__;
}

Assistant:

std::string format (std::string& value)
{
  return value;
}